

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O3

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_GetDevice
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,char *deviceId,
          IOTHUB_DEVICE *deviceInfo)

{
  IOTHUB_REGISTRYMANAGER_RESULT IVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_DEVICE_OR_MODULE IStack_c8;
  
  if ((deviceId == (char *)0x0 || registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) ||
      deviceInfo == (IOTHUB_DEVICE *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else {
      IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_GetDevice",0x642,1,"Input parameter cannot be NULL");
    }
  }
  else {
    memset(&IStack_c8,0,0xa0);
    IVar1 = IoTHubRegistryManager_GetDeviceOrModule
                      (registryManagerHandle,deviceId,(char *)0x0,&IStack_c8);
    if (IVar1 == IOTHUB_REGISTRYMANAGER_OK) {
      deviceInfo->deviceId = IStack_c8.deviceId;
      deviceInfo->primaryKey = IStack_c8.primaryKey;
      deviceInfo->secondaryKey = IStack_c8.secondaryKey;
      deviceInfo->generationId = IStack_c8.generationId;
      deviceInfo->eTag = IStack_c8.eTag;
      deviceInfo->connectionState = IStack_c8.connectionState;
      deviceInfo->connectionStateUpdatedTime = IStack_c8.connectionStateUpdatedTime;
      deviceInfo->status = IStack_c8.status;
      deviceInfo->statusReason = IStack_c8.statusReason;
      deviceInfo->statusUpdatedTime = IStack_c8.statusUpdatedTime;
      deviceInfo->lastActivityTime = IStack_c8.lastActivityTime;
      deviceInfo->cloudToDeviceMessageCount = IStack_c8.cloudToDeviceMessageCount;
      deviceInfo->isManaged = IStack_c8.isManaged;
      deviceInfo->configuration = IStack_c8.configuration;
      deviceInfo->deviceProperties = IStack_c8.deviceProperties;
      deviceInfo->serviceProperties = IStack_c8.serviceProperties;
      deviceInfo->authMethod = IStack_c8.authMethod;
      free(IStack_c8.moduleId);
      IStack_c8.moduleId = (char *)0x0;
      free(IStack_c8.managedBy);
    }
  }
  return IVar1;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_GetDevice(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const char* deviceId, IOTHUB_DEVICE* deviceInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceId == NULL) || (deviceInfo == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;
        memset(&deviceOrModuleInfo, 0, sizeof(deviceOrModuleInfo));

        result = IoTHubRegistryManager_GetDeviceOrModule(registryManagerHandle, deviceId, NULL, &deviceOrModuleInfo);
        if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            move_deviceOrModule_members_to_device(&deviceOrModuleInfo, deviceInfo);
            free_nonDevice_members_from_deviceOrModule(&deviceOrModuleInfo);
        }
    }

    return result;
}